

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O0

uint xmlDictHashName(uint seed,xmlChar *data,size_t maxLen,size_t *plen)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  ulong local_38;
  size_t i;
  uint h2;
  uint h1;
  size_t *plen_local;
  size_t maxLen_local;
  xmlChar *data_local;
  uint seed_local;
  
  i._4_4_ = seed ^ 0x3b00;
  i._0_4_ = seed << 0xf | seed >> 0x11;
  local_38 = 0;
  while( true ) {
    bVar3 = false;
    if (local_38 < maxLen) {
      bVar3 = data[local_38] != '\0';
    }
    if (!bVar3) break;
    i._4_4_ = (data[local_38] + i._4_4_) * 9;
    i._0_4_ = ((i._4_4_ + (uint)i) * 0x80 | i._4_4_ + (uint)i >> 0x19) * 5;
    local_38 = local_38 + 1;
  }
  uVar1 = ((uint)i << 0xe | (uint)i >> 0x12) + ((uint)i ^ i._4_4_);
  uVar2 = (uVar1 >> 6 | uVar1 * 0x4000000) + (uVar1 ^ (uint)i);
  uVar1 = (uVar2 * 0x20 | uVar2 >> 0x1b) + (uVar2 ^ uVar1);
  *plen = local_38;
  return (uVar1 >> 8 | uVar1 * 0x1000000) + (uVar1 ^ uVar2) | 0x80000000;
}

Assistant:

ATTRIBUTE_NO_SANITIZE_INTEGER
static unsigned
xmlDictHashName(unsigned seed, const xmlChar* data, size_t maxLen,
                size_t *plen) {
    unsigned h1, h2;
    size_t i;

    HASH_INIT(h1, h2, seed);

    for (i = 0; i < maxLen && data[i]; i++) {
        HASH_UPDATE(h1, h2, data[i]);
    }

    HASH_FINISH(h1, h2);

    *plen = i;
    return(h2 | MAX_HASH_SIZE);
}